

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum.pb.cc
# Opt level: O2

void __thiscall
proto3_preserve_unknown_enum_unittest::MyMessagePlusExtra::~MyMessagePlusExtra
          (MyMessagePlusExtra *this)

{
  ~MyMessagePlusExtra(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

MyMessagePlusExtra::~MyMessagePlusExtra() {
  // @@protoc_insertion_point(destructor:proto3_preserve_unknown_enum_unittest.MyMessagePlusExtra)
  SharedDtor(*this);
}